

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlock.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  SDL_Thread *pSVar4;
  int local_1c;
  int maxproc;
  int i;
  char **argv_local;
  int argc_local;
  
  iVar2 = SDL_Init(0);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"%s\n",uVar3);
    exit(1);
  }
  atexit(SDL_Quit_Wrapper);
  mutex = (SDL_mutex *)SDL_CreateMutex();
  pFVar1 = _stderr;
  if (mutex == (SDL_mutex *)0x0) {
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t create mutex: %s\n",uVar3);
    exit(1);
  }
  mainthread = SDL_ThreadID();
  printf("Main thread: %u\n",(ulong)mainthread);
  atexit(printid);
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    pSVar4 = (SDL_Thread *)SDL_CreateThread(Run,0);
    threads[local_1c] = pSVar4;
    if (pSVar4 == (SDL_Thread *)0x0) {
      fprintf(_stderr,"Couldn\'t create thread!\n");
    }
  }
  signal(2,terminate);
  Run((void *)0x0);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	int maxproc = 6;

	/* Load the SDL library */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "%s\n", SDL_GetError());
		exit(1);
	}
	atexit(SDL_Quit_Wrapper);

	if ( (mutex=SDL_CreateMutex()) == NULL ) {
		fprintf(stderr, "Couldn't create mutex: %s\n", SDL_GetError());
		exit(1);
	}

	mainthread = SDL_ThreadID();
	printf("Main thread: %u\n", mainthread);
	atexit(printid);
	for ( i=0; i<maxproc; ++i ) {
		if ( (threads[i]=SDL_CreateThread(Run, NULL)) == NULL )
			fprintf(stderr, "Couldn't create thread!\n");
	}
	signal(SIGINT, terminate);
	Run(NULL);

	return(0);	/* Never reached */
}